

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpart.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong local_38;
  size_t i;
  size_t partlen;
  char *part;
  char **ppcStack_18;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 3) {
    curl_mprintf("./testpart main sub\n");
  }
  else {
    iVar1 = getpart((char **)&partlen,&i,argv[1],argv[2],_stdin);
    if (iVar1 != 0) {
      return iVar1;
    }
    part._4_4_ = 0;
    for (local_38 = 0; local_38 < i; local_38 = local_38 + 1) {
      curl_mprintf("%c",(ulong)(uint)(int)*(char *)(partlen + local_38));
    }
    free((void *)partlen);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  int rc;
  char  *part;
  size_t partlen, i;

  if(argc< 3) {
    printf("./testpart main sub\n");
  }
  else {
    rc = getpart(&part, &partlen, argv[1], argv[2], stdin);
    if(rc)
      return rc;
    for(i = 0; i < partlen; i++)
      printf("%c", part[i]);
    free(part);
  }
  return 0;
}